

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

bool __thiscall IRBuilder::AllowNativeArrayProfileInfo(IRBuilder *this)

{
  bool bVar1;
  BOOL BVar2;
  intptr_t iVar3;
  
  BVar2 = Func::HasTry(this->m_func->topFunc);
  if ((((BVar2 == 0) || (bVar1 = Func::DoOptimizeTry(this->m_func->topFunc), bVar1)) &&
      (iVar3 = Func::GetWeakFuncRef(this->m_func), iVar3 != 0)) &&
     (bVar1 = Func::HasArrayInfo(this->m_func), !bVar1)) {
    return false;
  }
  bVar1 = Func::IsJitInDebugMode(this->m_func);
  return !bVar1;
}

Assistant:

bool
IRBuilder::AllowNativeArrayProfileInfo()
{
    return !((!(m_func->GetTopFunc()->HasTry() && !m_func->GetTopFunc()->DoOptimizeTry()) && m_func->GetWeakFuncRef() && !m_func->HasArrayInfo()) ||
        m_func->IsJitInDebugMode());
}